

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void sat_solver_set_resource_limits
               (sat_solver *s,ABC_INT64_T nConfLimit,ABC_INT64_T nInsLimit,
               ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  long lVar1;
  long lVar2;
  
  s->nRestarts = 0;
  s->nConfLimit = 0;
  s->nInsLimit = 0;
  if (nConfLimit == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = nConfLimit + (s->stats).conflicts;
    s->nConfLimit = lVar2;
  }
  if (nInsLimit == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = nInsLimit + (s->stats).propagations;
    s->nInsLimit = lVar1;
  }
  if ((nConfLimitGlobal != 0) && (lVar2 == 0 || nConfLimitGlobal < lVar2)) {
    s->nConfLimit = nConfLimitGlobal;
  }
  if ((nInsLimitGlobal != 0) && (lVar1 == 0 || nInsLimitGlobal < lVar1)) {
    s->nInsLimit = nInsLimitGlobal;
  }
  return;
}

Assistant:

void sat_solver_set_resource_limits(sat_solver* s, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    // set the external limits
    s->nRestarts  = 0;
    s->nConfLimit = 0;
    s->nInsLimit  = 0;
    if ( nConfLimit )
        s->nConfLimit = s->stats.conflicts + nConfLimit;
    if ( nInsLimit )
//        s->nInsLimit = s->stats.inspects + nInsLimit;
        s->nInsLimit = s->stats.propagations + nInsLimit;
    if ( nConfLimitGlobal && (s->nConfLimit == 0 || s->nConfLimit > nConfLimitGlobal) )
        s->nConfLimit = nConfLimitGlobal;
    if ( nInsLimitGlobal && (s->nInsLimit == 0 || s->nInsLimit > nInsLimitGlobal) )
        s->nInsLimit = nInsLimitGlobal;
}